

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvar.c
# Opt level: O3

void nnewframe(frameex1 *newpfra2,DLword *achain,int name)

{
  DLword *pDVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  DLword *pDVar6;
  DLword *pDVar7;
  DLword *pDVar8;
  ulong uVar9;
  uint uVar10;
  
  do {
    do {
      uVar2 = newpfra2->alink;
      if (uVar2 == 0) {
        error("alink = 0 in nnewframe");
      }
      else if (uVar2 == 0xb) {
        if ((name & 0xfff0000U) == 0) {
          iVar3 = name * 10 + 0x2c0002;
          *(short *)((ulong)(achain + 1) ^ 2) = (short)((uint)iVar3 >> 0x10);
          *(short *)((ulong)achain ^ 2) = (short)iVar3;
        }
        else {
          *(short *)((ulong)(achain + 1) ^ 2) = (short)((uint)(name + 2) >> 0x10);
          *(short *)((ulong)achain ^ 2) = (short)(name + 2);
        }
        return;
      }
      pDVar1 = Stackspace;
      uVar5 = uVar2 & 0xfffffffe;
      newpfra2 = (frameex1 *)(Stackspace + ((ulong)uVar5 - 10));
      if ((*(byte *)((long)Stackspace + (ulong)uVar5 * 2 + -0x11) & 2) == 0) {
        uVar10 = *(uint *)(Stackspace + ((ulong)uVar5 - 8));
      }
      else {
        uVar10 = *(uint *)(Stackspace + ((ulong)uVar5 - 4));
      }
      if ((uVar10 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar10);
      }
    } while (Lisp_world[(ulong)uVar10 + 7] < 2);
    pDVar8 = Lisp_world + (ulong)uVar10 + 8;
    uVar9 = (ulong)(Lisp_world[(ulong)uVar10 + 7] >> 1);
    pDVar6 = Lisp_world + (ulong)uVar10 + uVar9 * 2 + 8;
    do {
      pDVar7 = pDVar8 + 2;
      if ((*(int *)pDVar8 == name) ||
         (pDVar8 = pDVar8 + 4, iVar3 = *(int *)pDVar7, pDVar7 = pDVar8, iVar3 == name)) {
        uVar10 = *(uint *)(pDVar7 + uVar9 * 2 + -2) * 2;
        uVar4 = *(uint *)(pDVar7 + uVar9 * 2 + -2) & 0xff000000;
        if (uVar4 == 0xc0000000) {
          pDVar1 = pDVar1 + (ulong)uVar5 + (ulong)(uVar10 & 0x1ffffffe);
          if ((*(byte *)((ulong)pDVar1 ^ 2) & 1) == 0) {
            *(undefined4 *)achain = *(undefined4 *)pDVar1;
            return;
          }
          break;
        }
        if (uVar4 == 0) {
          *(undefined2 *)((ulong)(achain + 1) ^ 2) = 1;
          *(short *)((ulong)achain ^ 2) =
               (short)uVar10 + *(short *)((ulong)(pDVar1 + ((ulong)uVar5 - 0xb)) ^ 2);
          return;
        }
        error("Stack corrupted: bad value in name table");
        pDVar8 = pDVar7;
      }
    } while (pDVar8 < pDVar6);
  } while( true );
}

Assistant:

void nnewframe(struct frameex1 *newpfra2, DLword *achain, int name)
/* pointer to new frame extension */
/* pointer to 1st word of the searching
   FVAR slot in CurrentFrameExtension */
/* Atom index num. of target FVAR slot. */
{
  NAMETABLE *pindex; /* '90/06/06 osamu changed from DLword *
                               * index to indexs of new name table */
  UNSIGNED i;        /* temp for control */
  int nametablesize; /* NameTable size of current function header. */
  int ph;            /* alink temp, also phase */

newframe:
  /* assume that apframe1 points to the next frame to be scanned */
  ph = newpfra2->alink;
  if (ph == 0) error("alink = 0 in nnewframe");
  if (ph == ENDSTACKMARK) {
/* endStack */
#ifdef BIGATOMS
    if ((name & SEGMASK) != 0) /* New symbol */
    {
      int result = name + NEWATOM_VALUE_OFFSET;
      /*    printf("NEW-SYMBOL in nnewframe, 0x%x, result = 0x%x\n", name, result); */
      GETBASEWORD(achain, 1) = result >> 16;
      GETBASEWORD(achain, 0) = result & 0xFFFF;
    } else
#endif /* BIGATOMS */

#ifdef BIGVM
        if (name & SEGMASK) { /* It's a big-atom, so just offset from the base to get value */
      int result = name + NEWATOM_VALUE_OFFSET;
      GETBASEWORD(achain, 1) = result >> 16;
      GETBASEWORD(achain, 0) = result & 0xFFFF;
    } else { /* It's an "old" atom, so offset into the table of atoms */
      int result = (ATOMS_HI << 16) + (10 * name) + NEWATOM_VALUE_OFFSET;
      GETBASEWORD(achain, 1) = result >> 16;
      GETBASEWORD(achain, 0) = result & 0xFFFF;
    }
#else
    if (name >= 0x8000) {
      GETBASEWORD(achain, 1) = VALS_HI + 1;
      GETBASEWORD(achain, 0) = name * 2;
    } else {
      GETBASEWORD(achain, 1) = VALS_HI;
      GETBASEWORD(achain, 0) = name * 2;
    }
#endif /* BIGVM */
    return;
  }

  ph &= 0xFFFE; /* to mask off SLOW bit */
  newpfra2 = (struct frameex1 *)(-FRAMESIZE + Stackspace + ph);

  {                                  /* open new block to try and conserve address */
    struct fnhead *newpfn2; /* ptr to new fn header */

    if (newpfra2->validnametable) /* check VALIDNAMETABLE */
#ifdef BIGVM
      newpfn2 = (struct fnhead *)NativeAligned4FromLAddr(newpfra2->nametable);
    else
      newpfn2 = (struct fnhead *)NativeAligned4FromLAddr(newpfra2->fnheader);
#else
      newpfn2 = (struct fnhead *)NativeAligned4FromLAddr(
          ((newpfra2->hi2nametable) << 16 | newpfra2->lonametable));
    else
      newpfn2 = (struct fnhead *)NativeAligned4FromLAddr(
          ((newpfra2->hi2fnheader) << 16 | newpfra2->lofnheader));
#endif /* BIGVM */
    pindex = (NAMETABLE *)((DLword *)newpfn2 + FNHEADSIZE);
/* now pindex points 1st word of Nametable. */
#ifdef BIGATOMS
    nametablesize = (newpfn2->ntsize >> 1); /* ntsize is # of words in NT
                                               not # of element */
#else
    nametablesize = newpfn2->ntsize;
#endif
  }

  i = (UNSIGNED)(pindex + nametablesize);
  for (; (UNSIGNED)i > (UNSIGNED)pindex;) { /* searching in NewFuncHeader */
#ifdef BIGATOMS
/* These used to be GETWORDs, but NAMETABLE is a CELL in 3-byte */
#if 1
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 1;
      goto foundit;
    }
  cont2:
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 0;
      goto foundit;
    }
#else
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 1;
      goto foundit;
    }
  cont2:
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 2;
      goto foundit;
    }
  cont3:
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 3;
      goto foundit;
    }
  cont4:
    if ((int)*((NAMETABLE *)pindex++) == (int)name) {
      ph = 0;
      goto foundit;
    }
#endif

#else
    if (GETWORD((NAMETABLE *)pindex++) == (DLword)name) {
      ph = 1;
      goto foundit;
    }
  cont2:
    if (GETWORD((NAMETABLE *)pindex++) == (DLword)name) {
      ph = 2;
      goto foundit;
    }
  cont3:
    if (GETWORD((NAMETABLE *)pindex++) == (DLword)name) {
      ph = 3;
      goto foundit;
    }
  cont4:
    if (GETWORD((NAMETABLE *)pindex++) == (DLword)name) {
      ph = 0;
      goto foundit;
    }
#endif
    continue;
  foundit : {
    int fvartype;   /* probing fvar vartype */
    int fvaroffset; /* probing fvar varoffset */
    DLword *ppvar;  /* ptr to probing var candidate */
#ifdef BIGATOMS
    fvartype = (int)*(pindex + nametablesize - 1);
#else
    fvartype = GETWORD(pindex + nametablesize - 1);
#endif /* BIGATOMS */

    fvaroffset = NT_OFFSET_MASK & fvartype;
    fvaroffset <<= 1;
    fvartype &= NT_TYPE_MASK;
    switch (fvartype) {
      case FVPVARHI: /* 0x8000 or 0x80000000(BIGATOMS) */
        ppvar = FRAMESIZE + (DLword *)newpfra2 + fvaroffset;
        /* ppvar points to argued Pvar */
        if (WBITSPTR(ppvar)->xMSB) /* check UNBOUND (if *ppvar is negative , unbound) */
          switch (ph) {
            case 0: continue;
            case 1:
              goto cont2;
              /* case 2 : goto cont3;
              case 3 : goto cont4; */
          }
        GETBASEWORD(achain, 1) = STK_HI;
        GETBASEWORD(achain, 0) = 0xFFFF & LAddrFromNative(ppvar);
        /* save High word of PVAR slot address to FVAR slot */
        /* achain points to target FVAR slot */
        return;
      case FVFVARHI: /* 0xC000 or 0xC0000000(BIGATOMS) */
        ppvar = FRAMESIZE + (DLword *)newpfra2 + fvaroffset;
        if (WBITSPTR(ppvar)->LSB) goto endlookfor;
        /* Not Found in new FnHeader, scan next one. */
        *((int *)achain) = *((int *)ppvar);
        /* save address of FX to FVAR slot */
        /* achain points to target FVAR slot */
        return;
      case FVIVARHI: /* 0x000: */
        ppvar = -1 + (DLword *)newpfra2;
        /* ppvar points to IVAR field in Basic  frame */
        GETBASEWORD(achain, 1) = STK_HI;
        GETBASEWORD(achain, 0) = GETWORD(ppvar) + fvaroffset;
        return;
      default: error("Stack corrupted: bad value in name table");
    } /* end switch */
  }   /* end if */
  }   /* end for */

endlookfor:
  goto newframe; /* scan the next one */
}